

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_check_fp_string(png_const_charp string,png_size_t size)

{
  int iVar1;
  int iVar2;
  int state;
  png_size_t char_index;
  int local_1c;
  png_size_t local_18;
  
  local_1c = 0;
  local_18 = 0;
  iVar1 = png_check_fp_number(string,size,&local_1c,&local_18);
  iVar2 = 0;
  if ((iVar1 != 0) && ((local_18 == size || (string[local_18] == '\0')))) {
    iVar2 = local_1c;
  }
  return iVar2;
}

Assistant:

int
png_check_fp_string(png_const_charp string, png_size_t size)
{
   int        state=0;
   png_size_t char_index=0;

   if (png_check_fp_number(string, size, &state, &char_index) != 0 &&
      (char_index == size || string[char_index] == 0))
      return state /* must be non-zero - see above */;

   return 0; /* i.e. fail */
}